

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::traverseUnique
          (TraverseSchema *this,DOMElement *icElem,SchemaElementDecl *elemDecl)

{
  short *psVar1;
  SchemaInfo *pSVar2;
  MemoryManager *pMVar3;
  bool bVar4;
  int iVar5;
  XMLSize_t index;
  XMLCh *toCheck;
  RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *pRVar6;
  undefined4 extraout_var;
  IdentityConstraint *valueToAdopt;
  BaseRefVectorOf<xercesc_4_0::IdentityConstraint> *this_00;
  undefined4 extraout_var_00;
  long lVar7;
  XMLSize_t XVar8;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_40;
  
  pSVar2 = this->fSchemaInfo;
  if (icElem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,icElem);
  }
  local_40.fSchemaInfo = pSVar2;
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,icElem,0x30,this,false,this->fNonXSAttList);
  toCheck = getElementAttValue(this,icElem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  XVar8 = 0;
  if (toCheck != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)toCheck + XVar8);
      XVar8 = XVar8 + 2;
    } while (*psVar1 != 0);
    XVar8 = ((long)XVar8 >> 1) - 1;
  }
  bVar4 = XMLChar1_0::isValidNCName(toCheck,XVar8);
  if (bVar4) {
    if (this->fIdentityConstraintNames ==
        (RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *)0x0) {
      pRVar6 = (RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *)
               XMemory::operator_new(0x30,this->fGrammarPoolMemoryManager);
      pMVar3 = this->fGrammarPoolMemoryManager;
      pRVar6->fMemoryManager = pMVar3;
      pRVar6->fAdoptedElems = false;
      pRVar6->fBucketList = (RefHash2KeysTableBucketElem<xercesc_4_0::IdentityConstraint> **)0x0;
      pRVar6->fHashModulus = 0x1d;
      pRVar6->fCount = 0;
      iVar5 = (*pMVar3->_vptr_MemoryManager[3])();
      pRVar6->fBucketList =
           (RefHash2KeysTableBucketElem<xercesc_4_0::IdentityConstraint> **)
           CONCAT44(extraout_var,iVar5);
      memset((RefHash2KeysTableBucketElem<xercesc_4_0::IdentityConstraint> **)
             CONCAT44(extraout_var,iVar5),0,pRVar6->fHashModulus << 3);
      this->fIdentityConstraintNames = pRVar6;
    }
    else {
      bVar4 = RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::
              containsKey(this->fIdentityConstraintNames,toCheck,this->fTargetNSURI);
      if (bVar4) {
        reportSchemaError(this,icElem,L"http://apache.org/xml/messages/XMLErrors",0x82,toCheck,
                          (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        goto LAB_00331e5c;
      }
    }
    valueToAdopt = (IdentityConstraint *)XMemory::operator_new(0x38,this->fGrammarPoolMemoryManager)
    ;
    IC_Unique::IC_Unique
              ((IC_Unique *)valueToAdopt,toCheck,
               ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,
               this->fGrammarPoolMemoryManager);
    RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::put
              (this->fIdentityConstraintNames,toCheck,this->fTargetNSURI,valueToAdopt);
    bVar4 = traverseIdentityConstraint(this,valueToAdopt,icElem);
    if (bVar4) {
      this_00 = &elemDecl->fIdentityConstraints->
                 super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>;
      if (this_00 == (BaseRefVectorOf<xercesc_4_0::IdentityConstraint> *)0x0) {
        this_00 = (BaseRefVectorOf<xercesc_4_0::IdentityConstraint> *)
                  XMemory::operator_new(0x30,(elemDecl->super_XMLElementDecl).fMemoryManager);
        pMVar3 = (elemDecl->super_XMLElementDecl).fMemoryManager;
        ((BaseRefVectorOf<xercesc_4_0::IdentityConstraint> *)&this_00->_vptr_BaseRefVectorOf)->
        _vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_00409a70;
        this_00->fAdoptedElems = true;
        this_00->fCurCount = 0;
        this_00->fMaxCount = 0x10;
        this_00->fElemList = (IdentityConstraint **)0x0;
        this_00->fMemoryManager = pMVar3;
        iVar5 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,0x80);
        this_00->fElemList = (IdentityConstraint **)CONCAT44(extraout_var_00,iVar5);
        lVar7 = 0;
        do {
          this_00->fElemList[lVar7] = (IdentityConstraint *)0x0;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x10);
        ((BaseRefVectorOf<xercesc_4_0::IdentityConstraint> *)&this_00->_vptr_BaseRefVectorOf)->
        _vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_004099f8;
        elemDecl->fIdentityConstraints = (RefVectorOf<xercesc_4_0::IdentityConstraint> *)this_00;
      }
      BaseRefVectorOf<xercesc_4_0::IdentityConstraint>::ensureExtraCapacity(this_00,1);
      XVar8 = this_00->fCurCount;
      this_00->fElemList[XVar8] = valueToAdopt;
      this_00->fCurCount = XVar8 + 1;
      valueToAdopt->fNamespaceURI = this->fTargetNSURI;
    }
    else {
      RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::put
                (this->fIdentityConstraintNames,toCheck,this->fTargetNSURI,(IdentityConstraint *)0x0
                );
      (*(valueToAdopt->super_XSerializable)._vptr_XSerializable[1])(valueToAdopt);
    }
  }
  else {
    reportSchemaError(this,icElem,L"http://apache.org/xml/messages/XMLErrors",0x35,L"unique",toCheck
                      ,(XMLCh *)0x0,(XMLCh *)0x0);
  }
LAB_00331e5c:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return;
}

Assistant:

void TraverseSchema::traverseUnique(const DOMElement* const icElem,
                                    SchemaElementDecl* const elemDecl) {

    NamespaceScopeManager nsMgr(icElem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        icElem, GeneralAttributeCheck::E_Unique, this, false, fNonXSAttList
    );

    // -----------------------------------------------------------------------
    // Create identity constraint
    // -----------------------------------------------------------------------
    const XMLCh* name = getElementAttValue(icElem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))) {
        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                          SchemaSymbols::fgELT_UNIQUE, name);
        return;
    }

    if (!fIdentityConstraintNames) {
        fIdentityConstraintNames = new (fGrammarPoolMemoryManager) RefHash2KeysTableOf<IdentityConstraint>(29, (bool) false, fGrammarPoolMemoryManager);
    }
    else if (fIdentityConstraintNames->containsKey(name, fTargetNSURI)) {

        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::IC_DuplicateDecl, name);
        return;
    }

    IC_Unique* icUnique = new (fGrammarPoolMemoryManager) IC_Unique(name, elemDecl->getBaseName(), fGrammarPoolMemoryManager);
    Janitor<IC_Unique> janUnique(icUnique);

    fIdentityConstraintNames->put((void*) name, fTargetNSURI, icUnique);

    // -----------------------------------------------------------------------
    // Get selector and fields
    // -----------------------------------------------------------------------
    if (!traverseIdentityConstraint(icUnique, icElem)) {

        fIdentityConstraintNames->put((void*) name, fTargetNSURI, 0);
        return;
    }

    // -----------------------------------------------------------------------
    // Add identity cosntraints to element declaration
    // -----------------------------------------------------------------------
    elemDecl->addIdentityConstraint(icUnique);
    icUnique->setNamespaceURI(fTargetNSURI);
    janUnique.orphan();
}